

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O0

void __thiscall QPDF::JSONReactor::arrayStart(JSONReactor *this)

{
  bool bVar1;
  runtime_error *this_00;
  JSONReactor *this_local;
  
  bVar1 = std::vector<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
          ::empty(&this->stack);
  if (!bVar1) {
    containerStart(this);
    return;
  }
  QTC::TC("qpdf","QPDF_json top-level array",0);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"QPDF JSON must be a dictionary");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDF::JSONReactor::arrayStart()
{
    if (stack.empty()) {
        QTC::TC("qpdf", "QPDF_json top-level array");
        throw std::runtime_error("QPDF JSON must be a dictionary");
    }
    containerStart();
}